

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.cpp
# Opt level: O1

void __thiscall OpenMD::Inversion::calcForce(Inversion *this,RealType *angle,bool doParticlePot)

{
  double *pdVar1;
  pointer ppAVar2;
  Atom *pAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  DataStoragePointer DVar6;
  Snapshot *pSVar7;
  DataStoragePointer DVar8;
  Snapshot *pSVar9;
  DataStoragePointer DVar10;
  Snapshot *pSVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint i;
  long lVar17;
  long lVar18;
  undefined7 in_register_00000011;
  uint i_22;
  uint i_24;
  uint i_17;
  long lVar19;
  uint i_21;
  uint i_20;
  long lVar20;
  long lVar21;
  long lVar22;
  double tmp;
  double dVar23;
  double dVar24;
  double tmp_1;
  Vector<double,_3U> result_7;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector3<double> result_4;
  RealType dVdcosPhi;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  Vector3<double> result_14;
  Vector<double,_3U> result_20;
  double local_268 [4];
  undefined1 local_248 [16];
  double local_238;
  double local_228;
  double local_220;
  double local_218 [3];
  undefined4 local_1fc;
  double local_1f8 [4];
  Vector3d local_1d8;
  Vector3d local_1b8;
  double local_198 [4];
  double local_178;
  double local_170;
  double local_168 [4];
  double local_148 [4];
  double local_128 [3];
  double *local_110;
  double local_108 [4];
  Vector3d local_e8;
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [3];
  
  local_1fc = (undefined4)CONCAT71(in_register_00000011,doParticlePot);
  ppAVar2 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar3 = ppAVar2[1];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_48[0] = *pdVar1;
  local_48[1] = pdVar1[1];
  pAVar3 = ppAVar2[2];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_68[0] = *pdVar1;
  local_68[1] = pdVar1[1];
  pAVar3 = *ppAVar2;
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_c8[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_c8[0] = *pdVar1;
  local_c8[1] = pdVar1[1];
  pAVar3 = ppAVar2[3];
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar17 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_88[2] = (double)*(undefined8 *)(lVar17 + 0x10 + lVar18 * 0x18);
  pdVar1 = (double *)(lVar17 + lVar18 * 0x18);
  local_88[0] = *pdVar1;
  local_88[1] = pdVar1[1];
  local_1b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar17 = 0;
  do {
    local_1b8.super_Vector<double,_3U>.data_[lVar17] = local_48[lVar17] - local_c8[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_e8.super_Vector<double,_3U>.data_[2] = local_1b8.super_Vector<double,_3U>.data_[2];
  local_e8.super_Vector<double,_3U>.data_[0] = local_1b8.super_Vector<double,_3U>.data_[0];
  local_e8.super_Vector<double,_3U>.data_[1] = local_1b8.super_Vector<double,_3U>.data_[1];
  local_110 = angle;
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_e8);
  local_1d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar17 = 0;
  do {
    local_1d8.super_Vector<double,_3U>.data_[lVar17] = local_c8[lVar17] - local_68[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_1b8.super_Vector<double,_3U>.data_[2] = local_1d8.super_Vector<double,_3U>.data_[2];
  local_1b8.super_Vector<double,_3U>.data_[0] = local_1d8.super_Vector<double,_3U>.data_[0];
  local_1b8.super_Vector<double,_3U>.data_[1] = local_1d8.super_Vector<double,_3U>.data_[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_1b8);
  local_218[0] = 0.0;
  local_218[1] = 0.0;
  local_218[2] = 0.0;
  lVar17 = 0;
  do {
    local_218[lVar17] = local_c8[lVar17] - local_88[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_1d8.super_Vector<double,_3U>.data_[2] = local_218[2];
  local_1d8.super_Vector<double,_3U>.data_[0] = local_218[0];
  local_1d8.super_Vector<double,_3U>.data_[1] = local_218[1];
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,&local_1d8);
  local_218[0] = local_1d8.super_Vector<double,_3U>.data_[2] *
                 local_e8.super_Vector<double,_3U>.data_[1] -
                 local_e8.super_Vector<double,_3U>.data_[2] *
                 local_1d8.super_Vector<double,_3U>.data_[1];
  local_218[1] = local_1d8.super_Vector<double,_3U>.data_[0] *
                 local_e8.super_Vector<double,_3U>.data_[2] -
                 local_e8.super_Vector<double,_3U>.data_[0] *
                 local_1d8.super_Vector<double,_3U>.data_[2];
  local_218[2] = local_e8.super_Vector<double,_3U>.data_[0] *
                 local_1d8.super_Vector<double,_3U>.data_[1] -
                 local_1d8.super_Vector<double,_3U>.data_[0] *
                 local_e8.super_Vector<double,_3U>.data_[1];
  local_178 = 0.0;
  lVar17 = 0;
  do {
    local_178 = local_178 + local_218[lVar17] * local_218[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (local_178 < 0.0) {
    local_178 = sqrt(local_178);
  }
  else {
    local_178 = SQRT(local_178);
  }
  local_228 = 0.0;
  local_198[0] = local_1b8.super_Vector<double,_3U>.data_[2] *
                 local_1d8.super_Vector<double,_3U>.data_[1] -
                 local_1d8.super_Vector<double,_3U>.data_[2] *
                 local_1b8.super_Vector<double,_3U>.data_[1];
  local_198[1] = local_1b8.super_Vector<double,_3U>.data_[0] *
                 local_1d8.super_Vector<double,_3U>.data_[2] -
                 local_1d8.super_Vector<double,_3U>.data_[0] *
                 local_1b8.super_Vector<double,_3U>.data_[2];
  local_198[2] = local_1d8.super_Vector<double,_3U>.data_[0] *
                 local_1b8.super_Vector<double,_3U>.data_[1] -
                 local_1b8.super_Vector<double,_3U>.data_[0] *
                 local_1d8.super_Vector<double,_3U>.data_[1];
  lVar17 = 0;
  do {
    local_228 = local_228 + local_198[lVar17] * local_198[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (local_228 < 0.0) {
    local_228 = sqrt(local_228);
  }
  else {
    local_228 = SQRT(local_228);
  }
  dVar24 = 0.0;
  lVar17 = 0;
  do {
    dVar24 = dVar24 + local_218[lVar17] * local_218[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  lVar17 = 0;
  do {
    local_218[lVar17] = local_218[lVar17] / dVar24;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  dVar24 = 0.0;
  lVar17 = 0;
  do {
    dVar24 = dVar24 + local_198[lVar17] * local_198[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  lVar17 = 0;
  do {
    local_198[lVar17] = local_198[lVar17] / dVar24;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  dVar24 = 0.0;
  lVar17 = 0;
  do {
    dVar24 = dVar24 + local_218[lVar17] * local_198[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  dVar23 = 1.0;
  if (dVar24 <= 1.0) {
    dVar23 = dVar24;
  }
  dVar24 = -1.0;
  if (-1.0 <= dVar23) {
    dVar24 = dVar23;
  }
  if (this->inversionKey_ == itAngle) {
    local_220 = dVar24;
    dVar24 = acos(dVar24);
    (*this->inversionType_->_vptr_InversionType[2])
              (SUB84(dVar24,0),this->inversionType_,&this->potential_,local_128);
    dVar24 = 1.0 - local_220 * local_220;
    if (dVar24 < 0.0) {
      dVar24 = sqrt(dVar24);
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    local_170 = -local_128[0] /
                (double)(~-(ulong)(ABS(dVar24) < 1e-06) & (ulong)dVar24 |
                        -(ulong)(ABS(dVar24) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
    dVar24 = local_220;
  }
  else if (this->inversionKey_ == itCosAngle) {
    local_220 = dVar24;
    (*this->inversionType_->_vptr_InversionType[2])
              (SUB84(dVar24,0),this->inversionType_,&this->potential_,&local_170);
    dVar24 = local_220;
  }
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  lVar17 = 0;
  local_128[2] = 0.0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  do {
    local_1f8[lVar17] = local_218[lVar17] * dVar24;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_248 = ZEXT816(0);
  local_238 = 0.0;
  lVar17 = 0;
  do {
    *(double *)(local_248 + lVar17 * 8) = local_1f8[lVar17] - local_198[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar17 = 0;
  do {
    local_268[lVar17] = *(double *)(local_248 + lVar17 * 8) / local_178;
    dVar15 = local_268[2];
    dVar13 = local_268[1];
    dVar23 = local_268[0];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.0;
  lVar17 = 0;
  do {
    local_1f8[lVar17] = local_198[lVar17] * dVar24;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_248 = ZEXT816(0);
  local_238 = 0.0;
  lVar17 = 0;
  do {
    *(double *)(local_248 + lVar17 * 8) = local_1f8[lVar17] - local_218[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar17 = 0;
  do {
    local_268[lVar17] = *(double *)(local_248 + lVar17 * 8) / local_228;
    dVar16 = local_268[2];
    dVar14 = local_268[1];
    dVar12 = local_268[0];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_248._0_8_ =
       local_1d8.super_Vector<double,_3U>.data_[1] * dVar15 -
       dVar13 * local_1d8.super_Vector<double,_3U>.data_[2];
  local_248._8_8_ =
       local_1d8.super_Vector<double,_3U>.data_[2] * dVar23 -
       dVar15 * local_1d8.super_Vector<double,_3U>.data_[0];
  local_238 = local_1d8.super_Vector<double,_3U>.data_[0] * dVar13 -
              dVar23 * local_1d8.super_Vector<double,_3U>.data_[1];
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar17 = 0;
  do {
    local_268[lVar17] = *(double *)(local_248 + lVar17 * 8) * local_170;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_128[2] = local_268[2];
  local_128[0] = local_268[0];
  local_128[1] = local_268[1];
  local_1f8[0] = local_1b8.super_Vector<double,_3U>.data_[1] * dVar16 -
                 local_1b8.super_Vector<double,_3U>.data_[2] * dVar14;
  local_1f8[1] = local_1b8.super_Vector<double,_3U>.data_[2] * dVar12 -
                 local_1b8.super_Vector<double,_3U>.data_[0] * dVar16;
  local_1f8[2] = local_1b8.super_Vector<double,_3U>.data_[0] * dVar14 -
                 dVar12 * local_1b8.super_Vector<double,_3U>.data_[1];
  lVar17 = 0;
  local_108[0] = dVar15 * local_e8.super_Vector<double,_3U>.data_[1] -
                 dVar13 * local_e8.super_Vector<double,_3U>.data_[2];
  local_108[1] = dVar23 * local_e8.super_Vector<double,_3U>.data_[2] -
                 dVar15 * local_e8.super_Vector<double,_3U>.data_[0];
  local_108[2] = dVar13 * local_e8.super_Vector<double,_3U>.data_[0] -
                 dVar23 * local_e8.super_Vector<double,_3U>.data_[1];
  local_248 = ZEXT816(0);
  local_238 = 0.0;
  do {
    *(double *)(local_248 + lVar17 * 8) = local_1f8[lVar17] - local_108[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar17 = 0;
  do {
    local_268[lVar17] = *(double *)(local_248 + lVar17 * 8) * local_170;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_148[2] = local_268[2];
  local_148[0] = local_268[0];
  local_148[1] = local_268[1];
  dVar23 = dVar16 * local_1d8.super_Vector<double,_3U>.data_[0] -
           local_1d8.super_Vector<double,_3U>.data_[2] * dVar12;
  local_248._8_4_ = SUB84(dVar23,0);
  local_248._0_8_ =
       dVar14 * local_1d8.super_Vector<double,_3U>.data_[2] -
       local_1d8.super_Vector<double,_3U>.data_[1] * dVar16;
  local_248._12_4_ = (int)((ulong)dVar23 >> 0x20);
  local_238 = dVar12 * local_1d8.super_Vector<double,_3U>.data_[1] -
              local_1d8.super_Vector<double,_3U>.data_[0] * dVar14;
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar17 = 0;
  do {
    local_268[lVar17] = *(double *)(local_248 + lVar17 * 8) * local_170;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3);
  local_168[2] = local_268[2];
  local_168[0] = local_268[0];
  local_168[1] = local_268[1];
  ppAVar2 = (this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar3 = ppAVar2[1];
  DVar4 = (pAVar3->super_StuntDouble).storage_;
  pSVar5 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar17 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar18 = lVar17 * 0x18 +
           *(long *)((long)&(pSVar5->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar4);
  lVar19 = 0;
  do {
    *(double *)(lVar18 + lVar19 * 8) = local_128[lVar19] + *(double *)(lVar18 + lVar19 * 8);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  pAVar3 = *ppAVar2;
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  lVar18 = 0;
  do {
    local_268[lVar18] = local_148[lVar18] - local_128[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar18 = 0;
  do {
    local_a8[lVar18] = local_268[lVar18] + local_168[lVar18];
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  DVar6 = (pAVar3->super_StuntDouble).storage_;
  pSVar7 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar18 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar19 = lVar18 * 0x18 +
           *(long *)((long)&(pSVar7->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar6);
  lVar20 = 0;
  do {
    *(double *)(lVar19 + lVar20 * 8) = local_a8[lVar20] + *(double *)(lVar19 + lVar20 * 8);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  pAVar3 = ppAVar2[3];
  lVar19 = 0;
  do {
    local_148[lVar19] = -local_148[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  DVar8 = (pAVar3->super_StuntDouble).storage_;
  pSVar9 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar20 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar21 = lVar20 * 0x18 +
           *(long *)((long)&(pSVar9->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar8);
  lVar19 = 0;
  do {
    *(double *)(lVar21 + lVar19 * 8) = local_148[lVar19] + *(double *)(lVar21 + lVar19 * 8);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  pAVar3 = ppAVar2[2];
  lVar19 = 0;
  do {
    local_168[lVar19] = -local_168[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  DVar10 = (pAVar3->super_StuntDouble).storage_;
  pSVar11 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
  lVar22 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar19 = lVar22 * 0x18 +
           *(long *)((long)&(pSVar11->atomData).force.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar10);
  lVar21 = 0;
  do {
    *(double *)(lVar19 + lVar21 * 8) = local_168[lVar21] + *(double *)(lVar19 + lVar21 * 8);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  if ((char)local_1fc != '\0') {
    lVar19 = *(long *)((long)&(pSVar7->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar6);
    *(double *)(lVar19 + lVar18 * 8) = this->potential_ + *(double *)(lVar19 + lVar18 * 8);
    lVar18 = *(long *)((long)&(pSVar5->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar4);
    *(double *)(lVar18 + lVar17 * 8) = this->potential_ + *(double *)(lVar18 + lVar17 * 8);
    lVar17 = *(long *)((long)&(pSVar11->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar10);
    *(double *)(lVar17 + lVar22 * 8) = this->potential_ + *(double *)(lVar17 + lVar22 * 8);
    lVar17 = *(long *)((long)&(pSVar9->atomData).particlePot.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + DVar8);
    *(double *)(lVar17 + lVar20 * 8) = this->potential_ + *(double *)(lVar17 + lVar20 * 8);
  }
  dVar24 = acos(dVar24);
  *local_110 = (dVar24 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Inversion::calcForce(RealType& angle, bool doParticlePot) {
    // In OpenMD's version of an inversion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    Vector3d pos1 = atoms_[1]->getPos();
    Vector3d pos2 = atoms_[2]->getPos();
    Vector3d pos3 = atoms_[0]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r31 = pos1 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r31);
    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r31, r43);
    RealType rA = A.length();
    Vector3d B  = cross(r43, r23);
    RealType rB = B.length();

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    switch (inversionKey_) {
    case itCosAngle:
      inversionType_->calcForce(cos_phi, potential_, dVdcosPhi);
      break;
    case itAngle:
      RealType phi = acos(cos_phi);
      RealType dVdPhi;
      inversionType_->calcForce(phi, potential_, dVdPhi);
      RealType sin_phi = sqrt(1.0 - cos_phi * cos_phi);
      if (fabs(sin_phi) < 1.0E-6) { sin_phi = 1.0E-6; }
      dVdcosPhi = -dVdPhi / sin_phi;

      break;
    }

    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r43, dcosdA);
    f2 = dVdcosPhi * (cross(r23, dcosdB) - cross(r31, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r43);

    // In OpenMD's version of an improper torsion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    //  AMBER:   I - J - K - L   (e.g. K is sp2 hybridized carbon)
    //  OpenMD:  I - (J - K - L)  (e.g. I is sp2 hybridized carbon)

    // Confusing enough?  Good.

    atoms_[1]->addFrc(f1);
    atoms_[0]->addFrc(f2 - f1 + f3);
    atoms_[3]->addFrc(-f2);
    atoms_[2]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }